

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFHelper.h
# Opt level: O2

void __thiscall Assimp::DXF::LineReader::~LineReader(LineReader *this)

{
  std::__cxx11::string::~string((string *)&this->value);
  std::__cxx11::string::~string((string *)&(this->splitter).mCur);
  return;
}

Assistant:

LineReader(StreamReaderLE& reader)
    : splitter(reader,false,true)
    , groupcode( 0 )
    , value()
    , end() {
        // empty
    }